

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManMergeDist1Pairs
              (Mop_Man_t *p,Vec_Int_t *vGroup,Vec_Int_t *vGroupPrev,Vec_Int_t *vStats,int nLimit)

{
  int iVar1;
  int iVar2;
  int nCap;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec_Int_t *vPairs;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  word *pwVar10;
  word *pwVar11;
  word *pwVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint i;
  uint i_00;
  
  vPairs = Mop_ManFindDist1Pairs(p,vGroup);
  p_00 = Mop_ManCompatiblePairs(vPairs,vGroup->nSize);
  iVar1 = vGroup->nSize;
  iVar2 = vGroupPrev->nSize;
  nCap = p_00->nSize;
  p_01 = Vec_IntAlloc(nCap);
  i_00 = 0;
  do {
    if (nCap <= (int)(i_00 | 1)) {
      iVar5 = 0;
      iVar4 = p_01->nSize;
      if (p_01->nSize < 1) {
        iVar4 = iVar5;
      }
      for (; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        iVar6 = Vec_IntEntry(p_01,iVar5);
        iVar9 = Vec_IntEntry(vGroup,iVar6);
        if (iVar9 != -1) {
          pVVar3 = p->vFree;
          iVar9 = Vec_IntEntry(vGroup,iVar6);
          Vec_IntPush(pVVar3,iVar9);
          Vec_IntWriteEntry(vGroup,iVar6,-1);
        }
      }
      Vec_IntFree(p_01);
      if (0 < nCap) {
        Map_ManGroupCompact(vGroup);
      }
      Vec_IntFree(vPairs);
      Vec_IntFree(p_00);
      return (iVar2 + iVar1) - (vGroup->nSize + vGroupPrev->nSize);
    }
    iVar4 = Vec_IntEntry(p_00,i_00);
    iVar5 = Vec_IntEntry(p_00,i_00 | 1);
    iVar6 = Vec_IntEntry(vGroup,iVar4);
    pwVar10 = Mop_ManCubeIn(p,iVar6);
    iVar6 = Vec_IntEntry(vGroup,iVar5);
    pwVar11 = Mop_ManCubeIn(p,iVar6);
    uVar8 = p->nWordsIn;
    iVar6 = Mop_ManCheckDist1(pwVar10,pwVar11,uVar8);
    if (iVar6 == 0) {
      __assert_fail("Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                    ,0x1ef,
                    "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    uVar7 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = uVar7;
    }
    uVar14 = 0;
LAB_002e0334:
    if (uVar14 == uVar8) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                    ,0x15a,"int Mop_ManFindDiffVar(word *, word *, int)");
    }
    lVar13 = 0;
    i = uVar7;
    while( true ) {
      if (lVar13 == 0x40) goto LAB_002e0364;
      if (((pwVar11[uVar14] ^ pwVar10[uVar14]) >> ((byte)lVar13 & 0x3f) & 3) != 0) break;
      i = i + 1;
      lVar13 = lVar13 + 2;
    }
    iVar6 = Vec_IntEntry(vStats,i);
    if (iVar6 <= nLimit) {
      Vec_IntPush(p_01,iVar4);
      Vec_IntPush(p_01,iVar5);
      pVVar3 = p->vFree;
      if (pVVar3->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar8 = pVVar3->nSize - 1;
      pVVar3->nSize = uVar8;
      iVar6 = pVVar3->pArray[uVar8];
      pwVar12 = Mop_ManCubeIn(p,iVar6);
      uVar14 = (ulong)(uint)p->nWordsIn;
      if (p->nWordsIn < 1) {
        uVar14 = 0;
      }
      for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        pwVar12[uVar15] = pwVar11[uVar15] & pwVar10[uVar15];
      }
      pwVar10 = Mop_ManCubeOut(p,iVar6);
      iVar4 = Vec_IntEntry(vGroup,iVar4);
      pwVar11 = Mop_ManCubeOut(p,iVar4);
      iVar4 = Vec_IntEntry(vGroup,iVar5);
      pwVar12 = Mop_ManCubeOut(p,iVar4);
      uVar8 = p->nWordsOut;
      iVar4 = bcmp(pwVar11,pwVar12,(long)(int)uVar8 * 8);
      if (iVar4 != 0) {
        __assert_fail("!memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadPlaMo.c"
                      ,0x201,
                      "int Mop_ManMergeDist1Pairs(Mop_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
        pwVar10[uVar14] = pwVar11[uVar14];
      }
      Vec_IntPush(vGroupPrev,iVar6);
    }
    i_00 = i_00 + 2;
  } while( true );
LAB_002e0364:
  uVar14 = uVar14 + 1;
  uVar7 = uVar7 + 0x20;
  goto LAB_002e0334;
}

Assistant:

int Mop_ManMergeDist1Pairs( Mop_Man_t * p, Vec_Int_t * vGroup, Vec_Int_t * vGroupPrev, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vPairs    = Mop_ManFindDist1Pairs( p, vGroup );
    Vec_Int_t * vPairsNew = Mop_ManCompatiblePairs( vPairs, Vec_IntSize(vGroup) );
    int nCubes = Vec_IntSize(vGroup) + Vec_IntSize(vGroupPrev);
    int w, i, c1, c2, iCubeNew, iVar;
    // move cubes to the previous group
    word * pCube, * pCube1, * pCube2;
    Vec_Int_t * vToFree = Vec_IntAlloc( Vec_IntSize(vPairsNew) );
    Vec_IntForEachEntryDouble( vPairsNew, c1, c2, i )
    {
        pCube1 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeIn( p, Vec_IntEntry(vGroup, c2) );
        assert( Mop_ManCheckDist1(pCube1, pCube2, p->nWordsIn) );

        // skip those cubes that have frequently appearing variables
        iVar = Mop_ManFindDiffVar( pCube1, pCube2, p->nWordsIn );
        if ( Vec_IntEntry( vStats, iVar ) > nLimit )
            continue;
        Vec_IntPush( vToFree, c1 );
        Vec_IntPush( vToFree, c2 );

        iCubeNew  = Vec_IntPop( p->vFree );
        pCube  = Mop_ManCubeIn( p, iCubeNew );
        for ( w = 0; w < p->nWordsIn; w++ )
            pCube[w] = pCube1[w] & pCube2[w];

        pCube  = Mop_ManCubeOut( p, iCubeNew );
        pCube1 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c1) );
        pCube2 = Mop_ManCubeOut( p, Vec_IntEntry(vGroup, c2) );

        assert( !memcmp(pCube1, pCube2, sizeof(word)*p->nWordsOut) );
        for ( w = 0; w < p->nWordsOut; w++ )
            pCube[w] = pCube1[w];

        Vec_IntPush( vGroupPrev, iCubeNew );
    }
//    Vec_IntForEachEntry( vPairsNew, c1, i )
    Vec_IntForEachEntry( vToFree, c1, i )
    {
        if ( Vec_IntEntry(vGroup, c1) == -1 )
            continue;
        Vec_IntPush( p->vFree, Vec_IntEntry(vGroup, c1) );
        Vec_IntWriteEntry( vGroup, c1, -1 );
    }
    Vec_IntFree( vToFree );
    if ( Vec_IntSize(vPairsNew) > 0 )
        Map_ManGroupCompact( vGroup );
    Vec_IntFree( vPairs );
    Vec_IntFree( vPairsNew );
    return nCubes - Vec_IntSize(vGroup) - Vec_IntSize(vGroupPrev);
}